

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVarLengthArray<QPropertyBindingPrivatePtr,_256LL>::~QVarLengthArray
          (QVarLengthArray<QPropertyBindingPrivatePtr,_256LL> *this)

{
  undefined1 *ptr;
  QPropertyBindingPrivatePtr *this_00;
  long lVar1;
  
  lVar1 = (this->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase.s;
  if (0 < lVar1) {
    this_00 = (QPropertyBindingPrivatePtr *)
              (this->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase.ptr;
    lVar1 = lVar1 + 1;
    do {
      QPropertyBindingPrivatePtr::~QPropertyBindingPrivatePtr(this_00);
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  ptr = (undefined1 *)(this->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase.ptr;
  if ((QVLAStorage<8UL,_8UL,_256LL> *)ptr != &this->super_QVLAStorage<8UL,_8UL,_256LL>) {
    QtPrivate::sizedFree
              (ptr,(this->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase.a << 3);
    return;
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }